

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_get_nth_splitter_test(void)

{
  long *__ptr;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ushort *puVar5;
  bnode *__ptr_00;
  bid_t *pbVar6;
  bid_t bVar7;
  size_t i;
  char *pcVar8;
  long lVar9;
  __suseconds_t *p_Var10;
  long lVar11;
  ulong uVar12;
  bid_t bStack_290;
  timeval tStack_288;
  btree_kv_ops bStack_278;
  char *pcStack_200;
  code *pcStack_1f8;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined1 auStack_1d8 [8];
  undefined1 auStack_1d0 [8];
  char acStack_1c8 [8];
  timeval tStack_1c0;
  btree_kv_ops bStack_1b0;
  bnode *pbStack_130;
  __suseconds_t *p_Stack_128;
  long lStack_120;
  long *plStack_118;
  long **pplStack_110;
  btree_kv_ops bStack_108;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  timeval __test_begin;
  long *local_40;
  void *key;
  uint8_t v;
  
  lVar9 = 0;
  uStack_90 = 0x1045ae;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  uStack_90 = 0x1045b3;
  memleak_start();
  do {
    pcVar8 = *(char **)((long)&DAT_00109d70 + lVar9);
    uStack_90 = 0x1045c6;
    sVar4 = strlen(pcVar8);
    uVar2 = (int)sVar4 + 1;
    uVar12 = (ulong)(uVar2 & 0xffff);
    uStack_90 = 0x1045d5;
    puVar5 = (ushort *)malloc(uVar12 + 2);
    uVar1 = (ushort)uVar2;
    *puVar5 = uVar1 << 8 | uVar1 >> 8;
    uStack_90 = 0x1045f2;
    memcpy(puVar5 + 1,pcVar8,uVar12);
    *(ushort **)((long)&__test_begin.tv_usec + lVar9) = puVar5;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x30);
  uStack_90 = 0x10460b;
  __ptr_00 = (bnode *)malloc(0x1010);
  __ptr_00->kvsize = 0;
  __ptr_00->flag = 0;
  __ptr_00->level = 0;
  __ptr_00->nentry = 0;
  (__ptr_00->field_4).data = (void *)0x0;
  __ptr_00->kvsize = 0x901;
  __ptr_00->level = 1;
  __ptr_00->nentry = 6;
  (__ptr_00->field_4).data = __ptr_00 + 1;
  key._7_1_ = 'd';
  pplStack_110 = (long **)0x104642;
  btree_str_kv_get_kb64_vb64(&bStack_108);
  p_Var10 = &__test_begin.tv_usec;
  lVar9 = 0;
  do {
    pplStack_110 = (long **)0x10465a;
    (*bStack_108.set_kv)(__ptr_00,(idx_t)lVar9,p_Var10,(void *)((long)&key + 7));
    key._7_1_ = key._7_1_ + '\x01';
    lVar9 = lVar9 + 1;
    p_Var10 = p_Var10 + 1;
  } while (lVar9 != 6);
  local_40 = (long *)0x0;
  pplStack_110 = (long **)0x104681;
  (*bStack_108.get_nth_splitter)((bnode *)0x0,__ptr_00,&local_40);
  __ptr = local_40;
  if ((char)local_40[1] == *(char *)(__test_begin.tv_usec + 8) &&
      *local_40 == *(long *)__test_begin.tv_usec) {
    pplStack_110 = (long **)0x1046a5;
    free(__ptr_00);
    pplStack_110 = (long **)0x1046ad;
    free(__ptr);
    lVar9 = 0;
    do {
      pplStack_110 = (long **)0x1046b9;
      free((void *)(&__test_begin.tv_usec)[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
    pplStack_110 = (long **)0x1046c7;
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (kv_get_nth_splitter_test()::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    pplStack_110 = (long **)0x1046f8;
    fprintf(_stderr,pcVar8,"kv_get_nth_splitter_test");
    return;
  }
  pplStack_110 = (long **)kv_cmp_key_str_test;
  kv_get_nth_splitter_test();
  plStack_118 = __ptr;
  lVar11 = 0;
  pcStack_1f8 = (code *)0x10472b;
  pbStack_130 = __ptr_00;
  p_Stack_128 = p_Var10;
  lStack_120 = lVar9;
  pplStack_110 = &local_40;
  gettimeofday(&tStack_1c0,(__timezone_ptr_t)0x0);
  pcStack_1f8 = (code *)0x104730;
  memleak_start();
  uStack_1e8 = 0;
  pcStack_1f8 = (code *)0x104743;
  btree_str_kv_get_kb64_vb64(&bStack_1b0);
  do {
    pcVar8 = *(char **)((long)&DAT_00109da0 + lVar11);
    pcStack_1f8 = (code *)0x104756;
    sVar4 = strlen(pcVar8);
    uVar12 = sVar4 & 0xffff;
    pcStack_1f8 = (code *)0x104763;
    puVar5 = (ushort *)malloc(uVar12 + 2);
    *puVar5 = (ushort)sVar4 << 8 | (ushort)sVar4 >> 8;
    pcStack_1f8 = (code *)0x104780;
    memcpy(puVar5 + 1,pcVar8,uVar12);
    *(ushort **)(auStack_1d8 + lVar11 + -8) = puVar5;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x20);
  pcStack_1f8 = (code *)0x1047a0;
  iVar3 = (*bStack_1b0.cmp)(&uStack_1e0,&uStack_1e0,(void *)0x0);
  if (iVar3 == 0) {
    pcStack_1f8 = (code *)0x1047bb;
    iVar3 = (*bStack_1b0.cmp)(&uStack_1e0,auStack_1d8,(void *)0x0);
    if (iVar3 < 1) goto LAB_00104866;
    pcVar8 = acStack_1c8;
    pcStack_1f8 = (code *)0x1047d9;
    iVar3 = (*bStack_1b0.cmp)(auStack_1d0,pcVar8,(void *)0x0);
    if (iVar3 != -6) goto LAB_0010486b;
    pcStack_1f8 = (code *)0x1047f3;
    iVar3 = (*bStack_1b0.cmp)(&uStack_1e0,pcVar8,(void *)0x0);
    if (iVar3 < 1) goto LAB_00104870;
    pcStack_1f8 = (code *)0x10480a;
    iVar3 = (*bStack_1b0.cmp)(&uStack_1e8,&uStack_1e0,(void *)0x0);
    if (iVar3 != -1) goto LAB_00104875;
    pcStack_1f8 = (code *)0x104822;
    iVar3 = (*bStack_1b0.cmp)(&uStack_1e0,&uStack_1e8,(void *)0x0);
    if (iVar3 == 1) {
      pcStack_1f8 = (code *)0x104838;
      iVar3 = (*bStack_1b0.cmp)(&uStack_1e8,&uStack_1e8,(void *)0x0);
      if (iVar3 == 0) {
        pcStack_1f8 = (code *)0x104850;
        kv_cmp_key_str_test();
        return;
      }
      goto LAB_0010487f;
    }
  }
  else {
    pcStack_1f8 = (code *)0x104866;
    kv_cmp_key_str_test();
LAB_00104866:
    pcStack_1f8 = (code *)0x10486b;
    kv_cmp_key_str_test();
LAB_0010486b:
    pcStack_1f8 = (code *)0x104870;
    kv_cmp_key_str_test();
LAB_00104870:
    pcStack_1f8 = (code *)0x104875;
    kv_cmp_key_str_test();
LAB_00104875:
    pcStack_1f8 = (code *)0x10487a;
    kv_cmp_key_str_test();
  }
  pcStack_1f8 = (code *)0x10487f;
  kv_cmp_key_str_test();
LAB_0010487f:
  pcStack_1f8 = kv_bid_to_value_to_bid_test;
  kv_cmp_key_str_test();
  pcStack_200 = pcVar8;
  pcStack_1f8 = (code *)uVar12;
  gettimeofday(&tStack_288,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&bStack_278);
  bStack_290 = 10;
  pbVar6 = (bid_t *)(*bStack_278.bid2value)(&bStack_290);
  if (*pbVar6 != bStack_290) {
    kv_bid_to_value_to_bid_test();
  }
  bVar7 = (*bStack_278.value2bid)(pbVar6);
  if (bVar7 != bStack_290) {
    kv_bid_to_value_to_bid_test();
  }
  kv_bid_to_value_to_bid_test();
  return;
}

Assistant:

void kv_get_nth_splitter_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp;
    void *key;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (int i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // set *key to nth_splitter
    key = NULL;
    kv_ops->get_nth_splitter(NULL, node, &key);

    // verify key[0] is set as splitter
    cmp = memcmp(key, key_ptrs[0], ksize);
    TEST_CHK(cmp == 0);

    free(node);
    free(key);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_nth_splitter_test");
}